

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O1

void QThreadStoragePrivate::finish(QList<void_*> *tls)

{
  long lVar1;
  void *pvVar2;
  QBasicMutex copy;
  bool bVar3;
  Type *pTVar4;
  iterator iVar5;
  pointer ppvVar6;
  QThread *pQVar7;
  uint uVar8;
  QBasicMutex *this;
  ulong size;
  _func_void_void_ptr *p_Var9;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((tls->d).size != 0) &&
     (pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
               operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                           *)tls), pTVar4 != (Type *)0x0)) {
    lVar1 = (tls->d).size;
    while (lVar1 != 0) {
      iVar5 = QList<void_*>::end(tls);
      pvVar2 = iVar5.i[-1];
      iVar5.i[-1] = (void *)0x0;
      uVar8 = (int)(tls->d).size - 1;
      size = (ulong)(int)uVar8;
      this = (QBasicMutex *)tls;
      QList<void_*>::resize(tls,size);
      if (pvVar2 != (void *)0x0) {
        if ((AtomicType)destructorsMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
          LOCK();
          destructorsMutex.d_ptr._q_value._M_b._M_p =
               (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
          UNLOCK();
        }
        else {
          this = &destructorsMutex;
          QBasicMutex::lockInternal(&destructorsMutex);
        }
        pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
                 operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                             *)this);
        copy = destructorsMutex;
        if (size < (ulong)(pTVar4->d).size) {
          p_Var9 = (pTVar4->d).ptr[size];
        }
        else {
          p_Var9 = (_func_void_void_ptr *)0x0;
        }
        LOCK();
        destructorsMutex.d_ptr._q_value._M_b._M_p =
             (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
        UNLOCK();
        if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
          QBasicMutex::unlockInternalFutex(&destructorsMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
        }
        if (p_Var9 == (_func_void_void_ptr *)0x0) {
          bVar3 = QCoreApplication::instanceExists();
          if (bVar3) {
            local_58.context.version = 2;
            local_58.context._4_8_ = 0;
            local_58.context._12_8_ = 0;
            local_58.context.function._4_4_ = 0;
            local_58.context.category = "default";
            pQVar7 = QThread::currentThread();
            QMessageLogger::warning
                      (&local_58,"QThreadStorage: entry %d destroyed before end of thread %p",
                       (ulong)uVar8,pQVar7);
          }
        }
        else {
          (*p_Var9)(pvVar2);
          if ((long)size < (tls->d).size) {
            ppvVar6 = QList<void_*>::data(tls);
            ppvVar6[size] = (void *)0x0;
          }
        }
      }
      lVar1 = (tls->d).size;
    }
    QList<void_*>::clear(tls);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadStoragePrivate::finish(QList<void *> *tls)
{
    if (tls->isEmpty() || !destructors())
        return; // nothing to do

    DEBUG_MSG("QThreadStorageData: Destroying storage for thread %p", QThread::currentThread());
    while (!tls->isEmpty()) {
        void *&value = tls->last();
        void *q = value;
        value = nullptr;
        int i = tls->size() - 1;
        tls->resize(i);

        if (!q) {
            // data already deleted
            continue;
        }

        QMutexLocker locker(&destructorsMutex);
        void (*destructor)(void *) = destructors()->value(i);
        locker.unlock();

        if (!destructor) {
            if (QCoreApplication::instanceExists())
                qWarning("QThreadStorage: entry %d destroyed before end of thread %p",
                         i, QThread::currentThread());
            continue;
        }
        destructor(q); //crash here might mean the thread exited after qthreadstorage was destroyed

        if (tls->size() > i) {
            //re reset the tls in case it has been recreated by its own destructor.
            (*tls)[i] = nullptr;
        }
    }
    tls->clear();
}